

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O1

uchar * __thiscall Http2::Frame::hpackBlockBegin(Frame *this)

{
  FrameType FVar1;
  uchar *puVar2;
  
  FVar1 = type(this);
  puVar2 = dataBegin(this);
  return puVar2 + (ulong)(FVar1 == PUSH_PROMISE) * 4;
}

Assistant:

const uchar *Frame::hpackBlockBegin() const
{
    Q_ASSERT(validatePayload() == FrameStatus::goodFrame);

    const auto frameType = type();
    Q_ASSERT(frameType == FrameType::HEADERS ||
             frameType == FrameType::PUSH_PROMISE ||
             frameType == FrameType::CONTINUATION);

    const uchar *begin = dataBegin();
    if (frameType == FrameType::PUSH_PROMISE)
        begin += 4; // That's a promised stream, skip it.
    return begin;
}